

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O1

Vec_Int_t * Llb_DriverCollectCs(Aig_Man_t *pAig)

{
  uint uVar1;
  Vec_Int_t *p;
  int *piVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = pAig->nRegs;
  p = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar3 = iVar4;
  }
  p->nSize = 0;
  p->nCap = iVar3;
  if (iVar3 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 << 2);
  }
  p->pArray = piVar2;
  if (0 < pAig->nRegs) {
    iVar4 = 0;
    do {
      uVar1 = pAig->nTruePis + iVar4;
      if (((int)uVar1 < 0) || (pAig->vCis->nSize <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Vec_IntPush(p,*(int *)((long)pAig->vCis->pArray[uVar1] + 0x24));
      iVar4 = iVar4 + 1;
    } while (iVar4 < pAig->nRegs);
  }
  return p;
}

Assistant:

Vec_Int_t * Llb_DriverCollectCs( Aig_Man_t * pAig )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObj;
    int i;
    vVars = Vec_IntAlloc( Aig_ManRegNum(pAig) );
    Saig_ManForEachLo( pAig, pObj, i )
        Vec_IntPush( vVars, Aig_ObjId(pObj) );
    return vVars;
}